

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstring.cpp
# Opt level: O1

void __thiscall FString::FString(FString *this,char head,FString *tail)

{
  FStringData *pFVar1;
  ulong __n;
  size_t strlen;
  
  strlen = (ulong)*(uint *)(tail->Chars + -0xc) + 1;
  pFVar1 = FStringData::Alloc(strlen);
  this->Chars = (char *)(pFVar1 + 1);
  pFVar1->Len = (uint)strlen;
  *(char *)&pFVar1[1].Len = head;
  __n = (ulong)*(uint *)(tail->Chars + -0xc);
  memcpy((void *)((long)&pFVar1[1].Len + 1),tail->Chars,__n);
  *(undefined1 *)((long)&pFVar1[1].Len + __n + 1) = 0;
  return;
}

Assistant:

FString::FString (char head, const FString &tail)
{
	size_t len2 = tail.Len();
	AllocBuffer (1 + len2);
	Chars[0] = head;
	StrCopy (Chars + 1, tail);
}